

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_maybe_do_deferred_work(tsdn_t *tsdn,arena_t *arena,decay_t *decay,size_t npages_new)

{
  _Bool _Var1;
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  background_thread_info_t *pbVar5;
  nstime_t *remaining_sleep_00;
  nstime_t remaining_sleep;
  nstime_t local_30;
  
  pbVar5 = duckdb_je_background_thread_info;
  uVar4 = (ulong)arena->ind % duckdb_je_max_background_threads;
  _Var1 = malloc_mutex_trylock(tsdn,&duckdb_je_background_thread_info[uVar4].mtx);
  if (_Var1) {
    return;
  }
  pbVar5 = pbVar5 + uVar4;
  _Var1 = duckdb_je_background_thread_is_started(pbVar5);
  if (!_Var1) goto LAB_01e7cb43;
  if (((pbVar5->indefinite_sleep).repr & 1U) == 0) {
    _Var1 = malloc_mutex_trylock(tsdn,&decay->mtx);
    if (_Var1) goto LAB_01e7cb43;
    if (0 < (decay->time_ms).repr) {
      uVar3 = duckdb_je_nstime_ns(&pbVar5->next_wakeup);
      duckdb_je_nstime_init(&local_30,uVar3);
      iVar2 = duckdb_je_nstime_compare(&local_30,&decay->epoch);
      if (0 < iVar2) {
        duckdb_je_nstime_subtract(&local_30,&decay->epoch);
        if (npages_new != 0) {
          uVar3 = duckdb_je_decay_npages_purge_in(decay,&local_30,npages_new);
          pbVar5->npages_to_purge_new = pbVar5->npages_to_purge_new + uVar3;
        }
        (decay->mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock((pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x48));
        if (pbVar5->npages_to_purge_new < 0x401) goto LAB_01e7cb43;
        pbVar5->npages_to_purge_new = 0;
        remaining_sleep_00 = &local_30;
        goto LAB_01e7ca7a;
      }
    }
    (decay->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x48));
  }
  else {
    remaining_sleep_00 = (nstime_t *)0x0;
LAB_01e7ca7a:
    duckdb_je_background_thread_wakeup_early(pbVar5,remaining_sleep_00);
  }
LAB_01e7cb43:
  (pbVar5->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar5->mtx).field_0 + 0x48));
  return;
}

Assistant:

static void
arena_maybe_do_deferred_work(tsdn_t *tsdn, arena_t *arena, decay_t *decay,
    size_t npages_new) {
	background_thread_info_t *info = arena_background_thread_info_get(
	    arena);
	if (malloc_mutex_trylock(tsdn, &info->mtx)) {
		/*
		 * Background thread may hold the mutex for a long period of
		 * time.  We'd like to avoid the variance on application
		 * threads.  So keep this non-blocking, and leave the work to a
		 * future epoch.
		 */
		return;
	}
	if (!background_thread_is_started(info)) {
		goto label_done;
	}

	nstime_t remaining_sleep;
	if (background_thread_indefinite_sleep(info)) {
		background_thread_wakeup_early(info, NULL);
	} else if (arena_should_decay_early(tsdn, arena, decay, info,
	    &remaining_sleep, npages_new)) {
		info->npages_to_purge_new = 0;
		background_thread_wakeup_early(info, &remaining_sleep);
	}
label_done:
	malloc_mutex_unlock(tsdn, &info->mtx);
}